

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest17::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest17 *this)

{
  allocator<char> local_19;
  FunctionalTest17 *local_18;
  FunctionalTest17 *this_local;
  
  local_18 = this;
  this_local = (FunctionalTest17 *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nout VS_DATA\n{\n    vec4 vs_data;\n} result;\n\nsubroutine void subroutineTypeVS(out vec4 result);\n\nsubroutine(subroutineTypeVS) void subroutine1(out vec4 result)\n{\n    result = vec4(1, 2, 3, 4);\n}\n\nsubroutine uniform subroutineTypeVS function;\n\nvoid main()\n{\n    function(result.vs_data);\n}\n"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest17::getVertexShaderBody() const
{
	return "#version 400\n"
		   "\n"
		   "#extension GL_ARB_shader_subroutine : require\n"
		   "\n"
		   "out VS_DATA\n"
		   "{\n"
		   "    vec4 vs_data;\n"
		   "} result;\n"
		   "\n"
		   "subroutine void subroutineTypeVS(out vec4 result);\n"
		   "\n"
		   "subroutine(subroutineTypeVS) void subroutine1(out vec4 result)\n"
		   "{\n"
		   "    result = vec4(1, 2, 3, 4);\n"
		   "}\n"
		   "\n"
		   "subroutine uniform subroutineTypeVS function;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    function(result.vs_data);\n"
		   "}\n";
}